

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String * __thiscall Bstrlib::String::operator=(String *this,tagbstring *x)

{
  uchar *__dest;
  int length;
  
  if ((this->super_tagbstring).mlen < 1) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x133,"Write protection error");
  }
  length = x->slen;
  if (length < 0) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x134,"Failure in =(tagbstring) operator, badly formed tagbstring");
    length = x->slen;
  }
  if ((this->super_tagbstring).mlen <= length) {
    Alloc(this,length);
    length = x->slen;
  }
  (this->super_tagbstring).slen = length;
  __dest = (this->super_tagbstring).data;
  if (__dest == (uchar *)0x0) {
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x13b,"Failure in =(tagbstring) operator");
  }
  else {
    memcpy(__dest,x->data,(long)length);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return this;
}

Assistant:

const String& String::operator=(const tagbstring& x)
    {
        if (mlen <= 0)    bstringThrow("Write protection error");
        if (x.slen < 0)    bstringThrow("Failure in =(tagbstring) operator, badly formed tagbstring");
        if (x.slen >= mlen)    Alloc(x.slen);

        slen = x.slen;
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in =(tagbstring) operator");
        }
        else
        {
            memcpy(data, x.data, slen);
            data[slen] = '\0';
        }
        return *this;
    }